

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ps.c
# Opt level: O0

void bp_update_ps(mod2sparse *H,char *synd,double *log_prob_ratios,int iter,char *decoding)

{
  int iVar1;
  int iVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  int *in_RDI;
  long in_R8;
  double dVar3;
  int j;
  int i;
  int M;
  int N;
  mod2entry *e;
  double t;
  double dl;
  double pr;
  int local_58;
  int local_54;
  int *local_48;
  double local_38;
  double local_30;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
    if (*(char *)(in_RSI + local_54) == '\0') {
      local_38 = 1.0;
    }
    if (*(char *)(in_RSI + local_54) == '\x01') {
      local_38 = -1.0;
    }
    for (local_48 = *(int **)(*(long *)(in_RDI + 2) + (long)local_54 * 0x38 + 0x10); -1 < *local_48;
        local_48 = *(int **)(local_48 + 4)) {
      *(double *)(local_48 + 0xc) = local_38;
      local_38 = (2.0 / (*(double *)(local_48 + 10) + 1.0) - 1.0) * local_38;
    }
    local_38 = 1.0;
    for (local_48 = *(int **)(*(long *)(in_RDI + 2) + (long)local_54 * 0x38 + 8); -1 < *local_48;
        local_48 = *(int **)(local_48 + 2)) {
      *(double *)(local_48 + 0xc) =
           (1.0 - *(double *)(local_48 + 0xc) * local_38) /
           (*(double *)(local_48 + 0xc) * local_38 + 1.0);
      local_38 = (2.0 / (*(double *)(local_48 + 10) + 1.0) - 1.0) * local_38;
    }
  }
  for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
    local_30 = prob_ratio_intial;
    for (local_48 = *(int **)(*(long *)(in_RDI + 4) + (long)local_58 * 0x38 + 0x20); -1 < *local_48;
        local_48 = *(int **)(local_48 + 8)) {
      *(double *)(local_48 + 10) = local_30;
      local_30 = *(double *)(local_48 + 0xc) * local_30;
    }
    if (NAN(local_30)) {
      local_30 = 1.0;
    }
    dVar3 = log(1.0 / local_30);
    *(double *)(CONCAT71(in_register_00000011,in_DL) + (long)local_58 * 8) = dVar3;
    *(bool *)(in_R8 + local_58) = 1.0 <= local_30;
    local_30 = 1.0;
    for (local_48 = *(int **)(*(long *)(in_RDI + 4) + (long)local_58 * 0x38 + 0x18); -1 < *local_48;
        local_48 = *(int **)(local_48 + 6)) {
      *(double *)(local_48 + 10) = local_30 * *(double *)(local_48 + 10);
      if (NAN(*(double *)(local_48 + 10))) {
        local_48[10] = 0;
        local_48[0xb] = 0x3ff00000;
      }
      local_30 = *(double *)(local_48 + 0xc) * local_30;
    }
  }
  return;
}

Assistant:

void bp_update_ps(mod2sparse *H,
    char *synd,
    double *log_prob_ratios,
    int iter,
    char *decoding)
    {
        double pr, dl, t;
        mod2entry *e;
        int N, M;
        int i, j;

        M = mod2sparse_rows(H);
        N = mod2sparse_cols(H);

        /* Recompute likelihood ratios. */

        for (i = 0; i<M; i++)
        {
            if(synd[i]==0) dl = 1;
            if(synd[i]==1) dl=-1;
            for (e = mod2sparse_first_in_row(H,i);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_next_in_row(e))
            { e->lr = dl;
                dl *= 2/(1+e->pr) - 1;
            }
            dl = 1;
            for (e = mod2sparse_last_in_row(H,i);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_prev_in_row(e))
            { t = e->lr * dl;
                e->lr = (1-t)/(1+t);
                dl *= 2/(1+e->pr) - 1;
            }
        }

        /* Recompute probability ratios.  Also find the next guess based on the
           individually most likely values. */

        for (j = 0; j<N; j++)
        { pr = prob_ratio_intial;
            for (e = mod2sparse_first_in_col(H,j);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_next_in_col(e))
            { e->pr = pr;
                pr *= e->lr;
            }
            if (isnan(pr))
            { pr = 1;
            }
            log_prob_ratios[j]=log(1/pr);
            // if (bprb) bprb[j] = 1 - 1/(1+pr);
            decoding[j] = pr>=1;
            pr = 1;
            for (e = mod2sparse_last_in_col(H,j);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_prev_in_col(e))
            { e->pr *= pr;
                if (isnan(e->pr))
                { e->pr = 1;
                }
                pr *= e->lr;
            }
        }

}